

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_extract_dimensions.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  
  if (boost::detail::report_errors_remind()::r == '\0') {
    boost::report_errors();
  }
  boost::detail::report_errors_remind()::r = 1;
  if (boost::detail::report_errors_remind()::r == '\0') {
    boost::report_errors();
  }
  iVar2 = boost::detail::test_errors()::x;
  if (boost::detail::test_errors()::x == 0) {
    poVar1 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No errors detected.",0x13);
    iVar2 = 0;
  }
  else {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,boost::detail::test_errors()::x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," error",6);
    pcVar3 = "";
    if (iVar2 != 1) {
      pcVar3 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,(ulong)(iVar2 != 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," detected.",10);
    iVar2 = 1;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return iVar2;
}

Assistant:

int main()
{
    BOOST_TEST((is_same<
        extract_dimensions_t<int>, dimensions<>
    >::value));

    BOOST_TEST((is_same<
        extract_dimensions_t<int[ ]>, dimensions<dyn>
    >::value));

    BOOST_TEST((is_same<
        extract_dimensions_t<int[3]>, dimensions<3  >
    >::value));

    BOOST_TEST((is_same<
        extract_dimensions_t<int[ ][5]>, dimensions<dyn, 5>
    >::value));
    BOOST_TEST((is_same<
        extract_dimensions_t<int[3][5]>, dimensions<3,   5>
    >::value));

    BOOST_TEST((is_same<
        extract_dimensions_t<int[ ][5][9]>, dimensions<dyn, 5, 9>
    >::value));
    BOOST_TEST((is_same<
        extract_dimensions_t<int[3][5][9]>, dimensions<3,   5, 9>
    >::value));

    return boost::report_errors();
}